

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

work_t __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::maxValue
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  float *pfVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  long i;
  long pn;
  work_t ret;
  store_t_conflict in_stack_ffffffffffffffcc;
  float local_24;
  long local_20;
  long local_18;
  float local_c [3];
  
  local_c[0] = PixelTraits<float>::minValue();
  iVar2 = std::abs((int)in_RDI->n);
  local_18 = CONCAT44(extraout_var,iVar2);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    bVar1 = isValidS(in_RDI,in_stack_ffffffffffffffcc);
    if (bVar1) {
      local_24 = in_RDI->pixel[local_20];
      pfVar3 = std::max<float>(local_c,&local_24);
      local_c[0] = *pfVar3;
    }
  }
  return local_c[0];
}

Assistant:

work_t maxValue() const
    {
      work_t ret=ptraits::minValue();

      long pn=std::abs(n);
      for (long i=0; i<pn; i++)
      {
        if (isValidS(pixel[i]))
        {
          ret=std::max(ret, static_cast<work_t>(pixel[i]));
        }
      }

      return ret;
    }